

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O2

uint mtar_checksum(mtar_raw_header_t *rh)

{
  uint res;
  uint i;
  long lVar1;
  
  res = 0x100;
  for (lVar1 = 0; lVar1 != 0x94; lVar1 = lVar1 + 1) {
    res = res + (byte)rh->name[lVar1];
  }
  for (lVar1 = 0x9c; lVar1 != 0x200; lVar1 = lVar1 + 1) {
    res = res + (byte)rh->name[lVar1];
  }
  return res;
}

Assistant:

static unsigned mtar_checksum(const mtar_raw_header_t* rh) {
  unsigned i;
  const unsigned char *p = (const unsigned char*) rh;
  unsigned res = 256;
  for (i = 0; i < offsetof(mtar_raw_header_t, checksum); i++) {
    res += p[i];
  }
  for (i = offsetof(mtar_raw_header_t, type); i < sizeof(*rh); i++) {
    res += p[i];
  }
  return res;
}